

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O1

void __thiscall
Satyricon::SATSolver::remove_from_vect
          (SATSolver *this,
          vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *v,
          ClausePtr c)

{
  pointer *ppWVar1;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *paVar2;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 aVar3;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 *paVar4;
  bool bVar5;
  
  paVar4 = &((v->
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             )._M_impl.super__Vector_impl_data._M_start)->field_0;
  paVar2 = &((v->
             super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
             )._M_impl.super__Vector_impl_data._M_finish)->field_0;
  bVar5 = paVar4 == paVar2;
  if (!bVar5) {
    aVar3.clause = paVar4->clause;
    while (aVar3.clause != c) {
      paVar4 = paVar4 + 1;
      bVar5 = paVar4 == paVar2;
      if (bVar5) goto LAB_00113b7b;
      aVar3 = (anon_union_8_2_f7e3ed0a_for_Watcher_0)paVar4->clause;
    }
    *paVar4 = paVar2[-1];
    ppWVar1 = &(v->
               super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppWVar1 = *ppWVar1 + -1;
    if (!bVar5) {
      return;
    }
  }
LAB_00113b7b:
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                ,0x246,"void Satyricon::SATSolver::remove_from_vect(vector<Watcher> &, ClausePtr)");
}

Assistant:

void SATSolver::remove_from_vect( vector<Watcher> &v, ClausePtr c ) {
    for ( auto &i : v ) {
        if ( i.get_clause() == c ) {
            i = v.back();
            v.pop_back();
            return;
        }
    }
    assert(false);
}